

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurve::~IfcDimensionCurve(IfcDimensionCurve *this)

{
  IfcStyledItem::~IfcStyledItem((IfcStyledItem *)this,&PTR_construction_vtable_24__007ccc38);
  return;
}

Assistant:

IfcDimensionCurve() : Object("IfcDimensionCurve") {}